

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_connected_constraints
          (Proof *this,int p,int t,function<bool_(int,_int)> *adj)

{
  bool bVar1;
  pointer pIVar2;
  size_type sVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  int *piVar7;
  ostream *poVar8;
  int in_EDX;
  int in_ESI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  iterator var;
  int w_2;
  int v_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *o;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string m;
  int u;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ors;
  string n_1;
  int w_1;
  int v_1;
  int k;
  int last_k;
  string n;
  int w;
  int v;
  int cnum;
  int mapped_to_null;
  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__elements;
  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff700;
  int in_stack_fffffffffffff704;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff708;
  map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff710;
  _Self local_5c8 [6];
  _Self local_598;
  pair<int,_int> local_590;
  pair<long,_long> local_588;
  pair<int,_int> local_578;
  pair<long,_long> local_570;
  int local_560;
  int local_55c;
  int local_558;
  undefined1 local_554 [52];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_520;
  undefined1 *local_518;
  int local_510;
  reference local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4d8;
  undefined1 *local_4d0;
  int local_4c8;
  int local_4a0;
  int local_478;
  int local_450;
  _Base_ptr local_428;
  undefined1 local_420;
  string local_2c8 [36];
  int local_2a4;
  undefined1 local_2a0 [24];
  _Base_ptr local_288;
  undefined1 local_280;
  string local_188 [32];
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  pair<int,_int> local_158;
  pair<long,_long> local_150;
  pair<int,_int> local_140;
  pair<long,_long> local_138;
  pair<int,_int> local_128;
  pair<long,_long> local_120;
  pair<int,_int> local_110;
  pair<long,_long> local_108;
  _Base_ptr local_f8;
  undefined1 local_f0;
  undefined4 local_e8;
  string local_48 [32];
  int local_28;
  int local_24;
  undefined4 local_20;
  int local_1c [3];
  int local_10;
  int local_c [3];
  
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  pIVar2 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1aa42a);
  std::operator<<((ostream *)&pIVar2->field_0x50,"* selected vertices must be connected, walk 1\n");
  local_1c[0] = local_10;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x1aa45c);
  sVar3 = std::
          map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x1aa46b);
  local_20 = (undefined4)sVar3;
  for (local_24 = 0; local_24 < local_c[0]; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
      std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      std::operator+(in_stack_fffffffffffff708,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
      std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
      std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1aa57e);
      local_e8 = 1;
      std::tuple<int,_int,_int>::tuple<int,_int_&,_int_&,_true,_true>
                ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,(int *)in_stack_fffffffffffff6d8,
                 (int *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8);
      pVar9 = std::
              map<std::tuple<long,long,long>,std::__cxx11::string,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
              ::emplace<std::tuple<int,int,int>,std::__cxx11::string&>
                        (in_stack_fffffffffffff6e0,(tuple<int,_int,_int> *)in_stack_fffffffffffff6d8
                         ,in_stack_fffffffffffff6d0);
      local_f8 = (_Base_ptr)pVar9.first._M_node;
      local_f0 = pVar9.second;
      bVar1 = std::function<bool_(int,_int)>::operator()
                        ((function<bool_(int,_int)> *)in_stack_fffffffffffff6d0,
                         (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),
                         (int)in_stack_fffffffffffff6c8);
      if (bVar1) {
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aa78a);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 ~x");
        poVar4 = std::operator<<(poVar4,local_48);
        poVar4 = std::operator<<(poVar4," 1 ~x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1aa7f1);
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_110,&local_24,local_1c);
        std::pair<long,_long>::pair<int,_int,_true>(&local_108,&local_110);
        pmVar5 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        poVar4 = std::operator<<(poVar4,(string *)pmVar5);
        std::operator<<(poVar4," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aa896);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 ~x");
        poVar4 = std::operator<<(poVar4,local_48);
        poVar4 = std::operator<<(poVar4," 1 ~x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1aa8fd);
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_128,&local_28,local_1c);
        std::pair<long,_long>::pair<int,_int,_true>(&local_120,&local_128);
        pmVar5 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        poVar4 = std::operator<<(poVar4,(string *)pmVar5);
        std::operator<<(poVar4," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aa9a2);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
        poVar4 = std::operator<<(poVar4,local_48);
        poVar4 = std::operator<<(poVar4," 1 x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1aaa09);
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_140,&local_24,local_1c);
        std::pair<long,_long>::pair<int,_int,_true>(&local_138,&local_140);
        pmVar5 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        poVar4 = std::operator<<(poVar4,(string *)pmVar5);
        poVar4 = std::operator<<(poVar4," 1 x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1aaab6);
        std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_158,&local_28,local_1c);
        std::pair<long,_long>::pair<int,_int,_true>(&local_150,&local_158);
        pmVar5 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        poVar4 = std::operator<<(poVar4,(string *)pmVar5);
        std::operator<<(poVar4," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aab5b);
        pIVar2->nb_constraints = pIVar2->nb_constraints + 3;
      }
      else {
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aa652);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 ~x");
        poVar4 = std::operator<<(poVar4,local_48);
        std::operator<<(poVar4," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aa6b1);
        pIVar2->nb_constraints = pIVar2->nb_constraints + 1;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
    }
  }
  local_160 = 2;
  while( true ) {
    local_15c = local_160;
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1aabd9);
    poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,
                             "* selected vertices must be connected, walk ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_160);
    std::operator<<(poVar4,'\n');
    for (local_164 = 0; local_164 < local_c[0]; local_164 = local_164 + 1) {
      for (local_168 = 0; local_168 < local_164; local_168 = local_168 + 1) {
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        std::operator+((char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
        std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        std::operator+(in_stack_fffffffffffff708,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
        std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
        std::operator+(in_stack_fffffffffffff708,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1aad92);
        std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                  ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                   (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                   (int *)in_stack_fffffffffffff6c8);
        pVar9 = std::
                map<std::tuple<long,long,long>,std::__cxx11::string,std::less<std::tuple<long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long>const,std::__cxx11::string>>>
                ::emplace<std::tuple<int,int,int>,std::__cxx11::string&>
                          (in_stack_fffffffffffff6e0,
                           (tuple<int,_int,_int> *)in_stack_fffffffffffff6d8,
                           in_stack_fffffffffffff6d0);
        local_288 = (_Base_ptr)pVar9.first._M_node;
        local_280 = pVar9.second;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1aae26);
        for (local_2a4 = 0; local_2a4 < local_c[0]; local_2a4 = local_2a4 + 1) {
          if (((local_164 != local_168) && (local_164 != local_2a4)) && (local_2a4 != local_168)) {
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
            std::operator+((char *)in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
            std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
            std::operator+(in_stack_fffffffffffff708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
            std::operator+(in_stack_fffffffffffff708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            std::operator+(in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0);
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff708 >> 0x20));
            std::operator+(in_stack_fffffffffffff708,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700));
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
            std::
            unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
            operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        *)0x1ab054);
            std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                      ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffff6e0,
                       (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                       (int *)in_stack_fffffffffffff6c8,(int *)0x1ab097);
            pVar10 = std::
                     map<std::tuple<long,long,long,long>,std::__cxx11::string,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::__cxx11::string>>>
                     ::emplace<std::tuple<int,int,int,int>,std::__cxx11::string&>
                               ((map<std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff6e0,
                                (tuple<int,_int,_int,_int> *)in_stack_fffffffffffff6d8,
                                in_stack_fffffffffffff6d0);
            local_428 = (_Base_ptr)pVar10.first._M_node;
            local_420 = pVar10.second;
            pIVar2 = std::
                     unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   *)0x1ab0f0);
            poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
            std::
            unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
            operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        *)0x1ab11a);
            local_450 = local_160 / 2;
            std::max<int>(&local_2a4,&local_164);
            std::min<int>(&local_2a4,&local_164);
            std::tuple<int,_int,_int>::tuple<int,_const_int_&,_const_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                       (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                       (int *)in_stack_fffffffffffff6c8);
            std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                      ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                       (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
            pmVar6 = std::
                     map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
            poVar4 = std::operator<<(poVar4,(string *)pmVar6);
            poVar4 = std::operator<<(poVar4," 1 ~x");
            poVar4 = std::operator<<(poVar4,local_2c8);
            std::operator<<(poVar4," >= 1 ;\n");
            pIVar2 = std::
                     unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   *)0x1ab265);
            poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
            std::
            unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
            operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        *)0x1ab28f);
            local_478 = local_160 / 2;
            std::max<int>(&local_2a4,&local_168);
            std::min<int>(&local_2a4,&local_168);
            std::tuple<int,_int,_int>::tuple<int,_const_int_&,_const_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                       (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                       (int *)in_stack_fffffffffffff6c8);
            std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                      ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                       (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
            pmVar6 = std::
                     map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
            poVar4 = std::operator<<(poVar4,(string *)pmVar6);
            poVar4 = std::operator<<(poVar4," 1 ~x");
            poVar4 = std::operator<<(poVar4,local_2c8);
            std::operator<<(poVar4," >= 1 ;\n");
            pIVar2 = std::
                     unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   *)0x1ab3da);
            poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
            poVar4 = std::operator<<(poVar4,local_2c8);
            poVar4 = std::operator<<(poVar4," 1 ~x");
            std::
            unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
            operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        *)0x1ab441);
            local_4a0 = local_160 / 2;
            std::max<int>(&local_164,&local_2a4);
            std::min<int>(&local_164,&local_2a4);
            std::tuple<int,_int,_int>::tuple<int,_const_int_&,_const_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                       (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                       (int *)in_stack_fffffffffffff6c8);
            std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                      ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                       (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
            pmVar6 = std::
                     map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
            poVar4 = std::operator<<(poVar4,(string *)pmVar6);
            poVar4 = std::operator<<(poVar4," 1 ~x");
            std::
            unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
            operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        *)0x1ab557);
            local_4c8 = local_160 / 2;
            std::max<int>(&local_2a4,&local_168);
            std::min<int>(&local_2a4,&local_168);
            std::tuple<int,_int,_int>::tuple<int,_const_int_&,_const_int_&,_true,_true>
                      ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                       (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                       (int *)in_stack_fffffffffffff6c8);
            std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                      ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                       (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
            pmVar6 = std::
                     map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
            poVar4 = std::operator<<(poVar4,(string *)pmVar6);
            std::operator<<(poVar4," >= 1 ;\n");
            pIVar2 = std::
                     unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                   *)0x1ab665);
            pIVar2->nb_constraints = pIVar2->nb_constraints + 3;
            std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
          }
        }
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1ab97a);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 ~x");
        std::operator<<(poVar4,local_188);
        local_4d0 = local_2a0;
        local_4d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6c8);
        local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff6c8);
        while (bVar1 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff6d0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff6c8), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_4e8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_4d8);
          pIVar2 = std::
                   unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 *)0x1aba27);
          poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50," 1 x");
          std::operator<<(poVar4,(string *)local_4e8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_4d8);
        }
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1aba7c);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50," 1 x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1abaa6);
        local_510 = local_160 / 2;
        std::tuple<int,_int,_int>::tuple<int,_int_&,_int_&,_true,_true>
                  ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                   (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                   (int *)in_stack_fffffffffffff6c8);
        std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                  ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                   (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
        pmVar6 = std::
                 map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        std::operator<<(poVar4,(string *)pmVar6);
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1abb58);
        std::operator<<((ostream *)&pIVar2->field_0x50," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1abb7a);
        pIVar2->nb_constraints = pIVar2->nb_constraints + 1;
        local_518 = local_2a0;
        local_520._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6c8);
        local_554._44_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff6c8);
        while (bVar1 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff6d0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff6c8), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_554._36_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_520);
          pIVar2 = std::
                   unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 *)0x1abc08);
          poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
          poVar4 = std::operator<<(poVar4,local_188);
          poVar4 = std::operator<<(poVar4," 1 ~x");
          poVar4 = std::operator<<(poVar4,(string *)local_554._36_8_);
          std::operator<<(poVar4," >= 1 ;\n");
          pIVar2 = std::
                   unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                 *)0x1abca4);
          pIVar2->nb_constraints = pIVar2->nb_constraints + 1;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_520);
        }
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1abcd5);
        poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
        poVar4 = std::operator<<(poVar4,local_188);
        poVar4 = std::operator<<(poVar4," 1 ~x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x1abd2d);
        local_558 = local_160 / 2;
        in_stack_fffffffffffff710 =
             (map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_554;
        std::tuple<int,_int,_int>::tuple<int,_int_&,_int_&,_true,_true>
                  ((tuple<int,_int,_int> *)in_stack_fffffffffffff6e0,
                   (int *)in_stack_fffffffffffff6d8,(int *)in_stack_fffffffffffff6d0,
                   (int *)in_stack_fffffffffffff6c8);
        std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                  ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                   (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
        pmVar6 = std::
                 map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        in_stack_fffffffffffff708 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar4,(string *)pmVar6);
        std::operator<<((ostream *)in_stack_fffffffffffff708," >= 1 ;\n");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1abddc);
        pIVar2->nb_constraints = pIVar2->nb_constraints + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6e0);
        std::__cxx11::string::~string(in_stack_fffffffffffff6d0);
      }
    }
    in_stack_fffffffffffff704 = local_160;
    piVar7 = std::min<int>(local_c,&local_10);
    if (*piVar7 <= in_stack_fffffffffffff704) break;
    local_160 = local_160 << 1;
  }
  pIVar2 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1abea6);
  std::operator<<((ostream *)&pIVar2->field_0x50,
                  "* if two vertices are used, they must be connected\n");
  for (local_55c = 0; local_55c < local_c[0]; local_55c = local_55c + 1) {
    for (local_560 = 0; local_560 < local_55c; local_560 = local_560 + 1) {
      pIVar2 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x1abf08);
      poVar4 = std::operator<<((ostream *)&pIVar2->field_0x50,"1 x");
      pIVar2 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x1abf31);
      __elements = &pIVar2->variable_mappings;
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_578,&local_55c,local_1c);
      std::pair<long,_long>::pair<int,_int,_true>(&local_570,&local_578);
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
      poVar8 = std::operator<<(poVar4,(string *)pmVar5);
      poVar8 = std::operator<<(poVar8," 1 x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1abfae);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_590,&local_560,local_1c);
      std::pair<long,_long>::pair<int,_int,_true>(&local_588,&local_590);
      pmVar5 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
      std::operator<<(poVar8,(string *)pmVar5);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1ac017);
      std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                ((tuple<int,_int,_int> *)poVar4,(int *)__elements,(int *)in_stack_fffffffffffff6d0,
                 (int *)in_stack_fffffffffffff6c8);
      std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                 (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
      local_598._M_node =
           (_Base_ptr)
           std::
           map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(in_stack_fffffffffffff6c8,(key_type *)0x1ac06e);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1ac083);
      local_5c8[0]._M_node =
           (_Base_ptr)
           std::
           map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(in_stack_fffffffffffff6c8);
      bVar1 = std::operator==(&local_598,local_5c8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1ac0c7);
        in_stack_fffffffffffff6d0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&pIVar2->field_0x50," 1 x");
        pIVar2 = std::
                 unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               *)0x1ac0f0);
        in_stack_fffffffffffff6c8 = &pIVar2->connected_variable_mappings;
        std::tuple<int,_int,_int>::tuple<int_&,_int_&,_int_&,_true,_true>
                  ((tuple<int,_int,_int> *)poVar4,(int *)__elements,(int *)in_stack_fffffffffffff6d0
                   ,(int *)in_stack_fffffffffffff6c8);
        std::tuple<long,_long,_long>::tuple<int,_int,_int,_true,_true>
                  ((tuple<long,_long,_long> *)in_stack_fffffffffffff6d0,
                   (tuple<int,_int,_int> *)in_stack_fffffffffffff6c8);
        pmVar6 = std::
                 map<std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](in_stack_fffffffffffff710,(key_type *)in_stack_fffffffffffff708);
        std::operator<<((ostream *)in_stack_fffffffffffff6d0,(string *)pmVar6);
      }
      pIVar2 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x1ac15f);
      std::operator<<((ostream *)&pIVar2->field_0x50," >= 1 ;\n");
      pIVar2 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x1ac183);
      pIVar2->nb_constraints = pIVar2->nb_constraints + 1;
    }
  }
  return;
}

Assistant:

auto Proof::create_connected_constraints(int p, int t, const function<auto(int, int)->bool> & adj) -> void
{
    _imp->model_stream << "* selected vertices must be connected, walk 1\n";
    int mapped_to_null = t;
    int cnum = _imp->variable_mappings.size();

    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            string n = "conn1_" + to_string(v) + "_" + to_string(w);
            _imp->connected_variable_mappings.emplace(tuple{1, v, w}, n);
            if (! adj(v, w)) {
                // v not adjacent to w, so the walk does not exist
                _imp->model_stream << "1 ~x" << n << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }
            else {
                // v = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{v, mapped_to_null}] << " >= 1 ;\n";
                // w = null -> the walk does not exist
                _imp->model_stream << "1 ~x" << n << " 1 ~x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                // either v = null, or w = null, or the walk exists
                _imp->model_stream << "1 x" << n << " 1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                                   << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}] << " >= 1 ;\n";
                _imp->nb_constraints += 3;
            }
        }

    int last_k = 0;
    for (int k = 2 ; ; k *= 2) {
        last_k = k;
        _imp->model_stream << "* selected vertices must be connected, walk " << k << '\n';
        for (int v = 0; v < p; ++v)
            for (int w = 0; w < v; ++w) {
                string n = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w);
                _imp->connected_variable_mappings.emplace(tuple{k, v, w}, n);

                vector<string> ors;
                for (int u = 0; u < p; ++u) {
                    if (v != w && v != u && u != w) {
                        string m = "conn" + to_string(k) + "_" + to_string(v) + "_" + to_string(w) + "_via_" + to_string(u);
                        ors.push_back(m);
                        _imp->connected_variable_mappings_aux.emplace(tuple{k, v, w, u}, m);
                        // either the first half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, v), min(u, v)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // either the second half walk exists, or the via term is false
                        _imp->model_stream << "1 x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}]
                                           << " 1 ~x" << m << " >= 1 ;\n";
                        // one of the half walks is false, or the via term must be true
                        _imp->model_stream << "1 x" << m
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(v, u), min(v, u)}]
                                           << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, max(u, w), min(u, w)}] << " >= 1 ;\n";
                        _imp->nb_constraints += 3;
                    }
                }

                // one of the vias must be true, or a shorter walk exists, or the entry is false
                _imp->model_stream << "1 ~x" << n;
                for (auto & o : ors)
                    _imp->model_stream << " 1 x" << o;
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}];
                _imp->model_stream << " >= 1 ;\n";
                ++_imp->nb_constraints;

                // if the entry is false, then all of the vias must be false and the shorter walk must be false
                for (auto & o : ors) {
                    _imp->model_stream << "1 x" << n << " 1 ~x" << o << " >= 1 ;\n";
                    ++_imp->nb_constraints;
                }
                _imp->model_stream << "1 x" << n << " 1 ~x" << _imp->connected_variable_mappings[tuple{k / 2, v, w}] << " >= 1 ;\n";
                ++_imp->nb_constraints;
            }

        if (k >= min(p, t))
            break;
    }

    _imp->model_stream << "* if two vertices are used, they must be connected\n";
    for (int v = 0; v < p; ++v)
        for (int w = 0; w < v; ++w) {
            _imp->model_stream << "1 x" << _imp->variable_mappings[pair{v, mapped_to_null}]
                               << " 1 x" << _imp->variable_mappings[pair{w, mapped_to_null}];
            auto var = _imp->connected_variable_mappings.find(tuple{last_k, v, w});
            if (var != _imp->connected_variable_mappings.end())
                _imp->model_stream << " 1 x" << _imp->connected_variable_mappings[tuple{last_k, v, w}];
            _imp->model_stream << " >= 1 ;\n";
            ++_imp->nb_constraints;
        }
}